

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

bool __thiscall AActor::IsTeammate(AActor *this,AActor *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  bool local_31;
  int otherTeam;
  int myTeam;
  AActor *other_local;
  AActor *this_local;
  
  if (other == (AActor *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    iVar2 = FIntCVar::operator_cast_to_int(&deathmatch);
    if (((iVar2 == 0) && (this->player != (player_t *)0x0)) && (other->player != (player_t *)0x0)) {
      this_local._7_1_ = true;
    }
    else {
      bVar1 = FBoolCVar::operator_cast_to_bool(&teamplay);
      if (bVar1) {
        iVar2 = GetTeam(this);
        iVar3 = GetTeam(other);
        local_31 = iVar2 != 0xff && iVar2 == iVar3;
        this_local._7_1_ = local_31;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AActor::IsTeammate (AActor *other)
{
	if (!other)
	{
		return false;
	}
	else if (!deathmatch && player && other->player)
	{
		return true;
	}
	else if (teamplay)
	{
		int myTeam = GetTeam();
		int otherTeam = other->GetTeam();

		return (myTeam != TEAM_NONE && myTeam == otherTeam);
	}
	return false;
}